

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O1

bool __thiscall cmParseJacocoCoverage::XMLParser::FindPackagePath(XMLParser *this,string *fileName)

{
  int iVar1;
  
  iVar1 = (*(this->super_cmXMLParser)._vptr_cmXMLParser[0xf])
                    (this,fileName,&this->Coverage->SourceDir);
  if ((char)iVar1 != '\0') {
    return true;
  }
  iVar1 = (*(this->super_cmXMLParser)._vptr_cmXMLParser[0xf])
                    (this,fileName,&this->Coverage->BinaryDir);
  return SUB41(iVar1,0);
}

Assistant:

virtual bool FindPackagePath(std::string const& fileName)
  {
    // Search for the source file in the source directory.
    if (this->PackagePathFound(fileName, this->Coverage.SourceDir)) {
      return true;
    }

    // If not found there, check the binary directory.
    if (this->PackagePathFound(fileName, this->Coverage.BinaryDir)) {
      return true;
    }
    return false;
  }